

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_up_global_failure_tests.cpp
# Opt level: O3

void __thiscall SetUpFailureEnvironment::~SetUpFailureEnvironment(SetUpFailureEnvironment *this)

{
  Environment *unaff_RBX;
  
  (this->super_Environment)._vptr_Environment = (_func_int **)&PTR__Environment_00129890;
  iutest::TestEnv::ReleaseGlobalTestEnvironment(unaff_RBX);
  operator_delete(this,8);
  return;
}

Assistant:

class SetUpFailureEnvironment IUTEST_CXX_FINAL : public ::iutest::Environment
{
private:
    virtual void SetUp(void) IUTEST_CXX_OVERRIDE
    {
        if( setup_failure )
        {
            IUTEST_FAIL();
        }
    }
};

class TearDownFailureEnvironment IUTEST_CXX_FINAL : public ::iutest::Environment
{
private:
    virtual void TearDown(void) IUTEST_CXX_OVERRIDE
    {
        IUTEST_FAIL();
    }
}